

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void rsa2_openssh_blob(ssh_key *key,BinarySink *bs)

{
  RSAKey *rsa;
  BinarySink *bs_local;
  ssh_key *key_local;
  
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-7].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-6].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-5].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-2].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-4].vt);
  BinarySink_put_mp_ssh2(bs->binarysink_,(mp_int *)key[-3].vt);
  return;
}

Assistant:

static void rsa2_openssh_blob(ssh_key *key, BinarySink *bs)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);

    put_mp_ssh2(bs, rsa->modulus);
    put_mp_ssh2(bs, rsa->exponent);
    put_mp_ssh2(bs, rsa->private_exponent);
    put_mp_ssh2(bs, rsa->iqmp);
    put_mp_ssh2(bs, rsa->p);
    put_mp_ssh2(bs, rsa->q);
}